

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

bool __thiscall QMdiSubWindowPrivate::restoreFocus(QMdiSubWindowPrivate *this)

{
  bool bVar1;
  FocusPolicy FVar2;
  QWidget *this_00;
  QMdiSubWindowPrivate *in_RDI;
  QWidget *candidate;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = QPointer<QWidget>::isNull((QPointer<QWidget> *)0x631183);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    this_00 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x6311a4);
    QPointer<QWidget>::clear((QPointer<QWidget> *)0x6311ba);
    bVar1 = QWidget::hasFocus((QWidget *)
                              CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    if (!bVar1) {
      q_func(in_RDI);
      bVar1 = QWidget::isAncestorOf(this_00,(QWidget *)in_RDI);
      if (((bVar1) && (bVar1 = QWidget::isVisible((QWidget *)0x6311ef), bVar1)) &&
         (FVar2 = QWidget::focusPolicy(this_00), FVar2 != NoFocus)) {
        QWidget::setFocus((QWidget *)0x63120e);
        return true;
      }
    }
    bVar1 = QWidget::hasFocus((QWidget *)
                              CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  }
  return bVar1;
}

Assistant:

bool QMdiSubWindowPrivate::restoreFocus()
{
    if (restoreFocusWidget.isNull())
        return false;
    QWidget *candidate = restoreFocusWidget;
    restoreFocusWidget.clear();
    if (!candidate->hasFocus() && q_func()->isAncestorOf(candidate)
        && candidate->isVisible()
        && candidate->focusPolicy() != Qt::NoFocus) {
        candidate->setFocus();
        return true;
    }
    return candidate->hasFocus();
}